

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GetConfigAttribSimpleCase::checkCaveat(GetConfigAttribSimpleCase *this,EGLint value)

{
  MessageBuilder *this_00;
  MessageBuilder local_1a0;
  TestLog *local_20;
  TestLog *log;
  GetConfigAttribSimpleCase *pGStack_10;
  EGLint value_local;
  GetConfigAttribSimpleCase *this_local;
  
  if (((value != 0x3038) && (value != 0x3050)) && (value != 0x3051)) {
    log._4_4_ = value;
    pGStack_10 = this;
    local_20 = tcu::TestContext::getLog
                         ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1a0,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
    this_00 = tcu::MessageBuilder::operator<<
                        (&local_1a0,(char (*) [38])"Fail, invalid EGL_CONFIG_CAVEAT value");
    tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a0);
    tcu::TestContext::setTestResult
              ((this->super_GetConfigAttribCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Invalid value");
  }
  return;
}

Assistant:

void checkCaveat (EGLint value)
	{
		if (!(value == EGL_NONE || value == EGL_SLOW_CONFIG || value == EGL_NON_CONFORMANT_CONFIG))
		{
			TestLog&	log	= m_testCtx.getLog();

			log << TestLog::Message << "Fail, invalid EGL_CONFIG_CAVEAT value" << TestLog::EndMessage;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid value");
		}
	}